

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O0

pseudo_t linearize_inc_dec(dmr_C *C,entrypoint *ep,expression *expr,int postop)

{
  int op_00;
  int iVar1;
  dmr_C *left;
  pseudo_t right;
  dmr_C *local_80;
  int op;
  pseudo_t one;
  pseudo_t new;
  pseudo_t old;
  access_data ad;
  int postop_local;
  expression *expr_local;
  entrypoint *ep_local;
  dmr_C *C_local;
  
  ad._36_4_ = postop;
  memset(&old,0,0x28);
  op_00 = 10;
  if (expr->op == 0x101) {
    op_00 = 9;
  }
  iVar1 = linearize_address_gen(C,ep,(expr->field_5).field_3.unop,(access_data *)&old);
  if (iVar1 == 0) {
    C_local = (dmr_C *)&C->L->void_pseudo;
  }
  else {
    left = (dmr_C *)linearize_load_gen(C,ep,(access_data *)&old);
    right = dmrC_value_pseudo(C,expr->ctype,(expr->field_5).field_3.op_value);
    local_80 = (dmr_C *)add_binary_op(C,ep,expr->ctype,op_00,(pseudo_t)left,right);
    linearize_store_gen(C,ep,(pseudo_t)local_80,(access_data *)&old);
    finish_address_gen(ep,(access_data *)&old);
    if (ad._36_4_ != 0) {
      local_80 = left;
    }
    C_local = local_80;
  }
  return (pseudo_t)C_local;
}

Assistant:

static pseudo_t linearize_inc_dec(struct dmr_C *C, struct entrypoint *ep, struct expression *expr, int postop)
{
	struct access_data ad;
	pseudo_t old, new, one;
        
        memset(&ad, 0, sizeof ad);
	int op = expr->op == SPECIAL_INCREMENT ? OP_ADD : OP_SUB;

	if (!linearize_address_gen(C, ep, expr->unop, &ad))
		return VOID_PSEUDO(C);

	old = linearize_load_gen(C, ep, &ad);
	one = dmrC_value_pseudo(C, expr->ctype, expr->op_value);
	new = add_binary_op(C, ep, expr->ctype, op, old, one);
	linearize_store_gen(C, ep, new, &ad);
	finish_address_gen(ep, &ad);
	return postop ? old : new;
}